

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

uint __thiscall ON_3dmObjectAttributes::SizeOf(ON_3dmObjectAttributes *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = ON_wString::Length(&this->m_name);
  iVar3 = ON_wString::Length(&this->m_url);
  iVar1 = (this->m_group).m_capacity;
  uVar4 = ON_Object::SizeOf(&this->super_ON_Object);
  return uVar4 + (iVar3 + iVar2 + iVar1) * 4 + 0x160;
}

Assistant:

unsigned int ON_3dmObjectAttributes::SizeOf() const
{
  unsigned int sz = sizeof(*this) - sizeof(ON_Object) 
                  + m_name.Length()*sizeof(wchar_t)
                  + m_url.Length()*sizeof(wchar_t)
                  + m_group.SizeOfArray()
                  + ON_Object::SizeOf();
  return sz;
}